

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RigidBody.cpp
# Opt level: O0

bool __thiscall OpenMD::RigidBody::getAtomPos(RigidBody *this,Vector3d *pos,uint index)

{
  ulong uVar1;
  size_type sVar2;
  size_type sVar3;
  uint in_EDX;
  StuntDouble *in_RDI;
  Vector3d *in_stack_00000040;
  StuntDouble *in_stack_00000048;
  Vector3d ref;
  undefined4 in_stack_ffffffffffffff80;
  undefined4 in_stack_ffffffffffffff84;
  bool local_1;
  
  uVar1 = (ulong)in_EDX;
  sVar2 = std::vector<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>::size
                    ((vector<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_> *)&in_RDI[2].mass_);
  if (sVar2 <= uVar1) {
    sVar3 = std::vector<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>::size
                      ((vector<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_> *)&in_RDI[2].mass_);
    snprintf(painCave.errMsg,2000,
             "%d is an invalid index. The current rigid body contans %zu atoms.\n",(ulong)in_EDX,
             sVar3);
    painCave.isFatal = 0;
    simError();
  }
  else {
    std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>::operator[]
              ((vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_> *)
               &in_RDI[2].properties_.propMap_._M_t._M_impl.super__Rb_tree_header._M_header._M_right
               ,(ulong)in_EDX);
    StuntDouble::body2Lab(in_stack_00000048,in_stack_00000040);
    StuntDouble::getPos(in_RDI);
    OpenMD::operator+((Vector<double,_3U> *)in_RDI,
                      (Vector<double,_3U> *)
                      CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80));
    Vector3<double>::operator=
              ((Vector3<double> *)in_RDI,
               (Vector<double,_3U> *)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80));
  }
  local_1 = sVar2 > uVar1;
  return local_1;
}

Assistant:

bool RigidBody::getAtomPos(Vector3d& pos, unsigned int index) {
    if (index < atoms_.size()) {
      Vector3d ref = body2Lab(refCoords_[index]);
      pos          = getPos() + ref;
      return true;
    } else {
      snprintf(
          painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
          "%d is an invalid index. The current rigid body contans %zu atoms.\n",
          index, atoms_.size());
      painCave.isFatal = 0;
      simError();
      return false;
    }
  }